

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProString,_QHashDummyValue>_>::Data
          (Data<QHashPrivate::Node<ProString,_QHashDummyValue>_> *this,
          Data<QHashPrivate::Node<ProString,_QHashDummyValue>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ProString *this_00;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  R RVar7;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar5 = other->numBuckets;
  sVar6 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar6;
  this->spans = (Span *)0x0;
  RVar7 = allocateSpans(sVar5);
  this->spans = (Span *)RVar7.spans;
  if (RVar7.nSpans != 0) {
    lVar4 = 0;
    sVar5 = 0;
    do {
      pSVar2 = other->spans;
      sVar6 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar6 + lVar4];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar5].entries;
          this_00 = &Span<QHashPrivate::Node<ProString,_QHashDummyValue>_>::insert
                               (this->spans + sVar5,sVar6)->key;
          ProString::ProString(this_00,(ProString *)((pEVar3->storage).data + (uint)bVar1 * 0x30));
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != 0x80);
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0x90;
    } while (sVar5 != RVar7.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }